

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O2

size_t __thiscall lattice::graph::add_bond(graph *this,size_t s,size_t t,int tp)

{
  long lVar1;
  ulong uVar2;
  invalid_argument *this_00;
  size_t t_local;
  size_t s_local;
  size_t b;
  bond_t local_38;
  
  lVar1 = (long)(this->sites_).
                super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->sites_).
                super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar2 = lVar1 / 0x38;
  lVar1 = lVar1 % 0x38;
  t_local = t;
  s_local = s;
  if ((s < uVar2) && (t < uVar2)) {
    if (s != t) {
      b = ((long)(this->bonds_).
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->bonds_).
                super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_38.source = s;
      local_38.target = t;
      local_38.type = tp;
      std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::
      emplace_back<lattice::graph::bond_t>(&this->bonds_,&local_38);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&(this->sites_).
                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                  ._M_impl.super__Vector_impl_data._M_start[s].neighbors,&t_local);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&(this->sites_).
                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                  ._M_impl.super__Vector_impl_data._M_start[s].neighbor_bonds,&b);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&(this->sites_).
                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                  ._M_impl.super__Vector_impl_data._M_start[t_local].neighbors,&s_local);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&(this->sites_).
                  super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                  ._M_impl.super__Vector_impl_data._M_start[t_local].neighbor_bonds,&b);
      return b;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10,0x38,lVar1);
    std::invalid_argument::invalid_argument(this_00,"self loop is not allowed");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10,0x38,lVar1);
    std::invalid_argument::invalid_argument(this_00,"site index out of range");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::size_t add_bond(std::size_t s, std::size_t t, int tp) {
    if (s >= sites_.size() || t >= sites_.size())
      throw std::invalid_argument("site index out of range");
    if (s == t)
      throw std::invalid_argument("self loop is not allowed");
    std::size_t b = bonds_.size();
    bonds_.push_back(bond_t(s, t, tp));
    sites_[s].neighbors.push_back(t);
    sites_[s].neighbor_bonds.push_back(b);
    sites_[t].neighbors.push_back(s);
    sites_[t].neighbor_bonds.push_back(b);
    return b;
  }